

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O3

void __thiscall ChatWindow::userLeft(ChatWindow *this,QString *username)

{
  QStandardItemModel *pQVar1;
  QArrayData *pQVar2;
  undefined4 uVar3;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  QString local_88;
  QArrayData *local_70 [3];
  undefined1 local_58 [24];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_a8 = 0xffffffffffffffff;
  local_a0 = 0;
  uStack_98 = 0;
  uVar3 = (**(code **)(*(long *)this->m_chatModel + 0x78))(this->m_chatModel,&local_a8);
  local_a8 = 0xffffffffffffffff;
  local_a0 = 0;
  uStack_98 = 0;
  (**(code **)(*(long *)this->m_chatModel + 0xf8))(this->m_chatModel,uVar3,1,&local_a8);
  pQVar1 = this->m_chatModel;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_58,pQVar1,uVar3,0);
  QMetaObject::tr((char *)local_70,(char *)&staticMetaObject,0x10a90e);
  QString::arg(&local_88,(int)local_70,(QChar)(char16_t)username);
  QVariant::QVariant((QVariant *)&local_a8,&local_88);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_58,&local_a8,2);
  QVariant::~QVariant((QVariant *)&local_a8);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_70[0] != (QArrayData *)0x0) {
    LOCK();
    (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70[0],2,8);
    }
  }
  pQVar1 = this->m_chatModel;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_58,pQVar1,uVar3,0);
  QVariant::QVariant((QVariant *)&local_a8,0x84);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_58,&local_a8,7);
  QVariant::~QVariant((QVariant *)&local_a8);
  pQVar1 = this->m_chatModel;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_58,pQVar1,uVar3,0);
  QBrush::QBrush((QBrush *)&local_88,7,1);
  QBrush::operator_cast_to_QVariant((QBrush *)&local_a8);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_58,&local_a8,9);
  QVariant::~QVariant((QVariant *)&local_a8);
  QBrush::~QBrush((QBrush *)&local_88);
  QAbstractItemView::scrollToBottom();
  if ((this->m_lastUserName).d.ptr != (char16_t *)0x0) {
    pQVar2 = &((this->m_lastUserName).d.d)->super_QArrayData;
    (this->m_lastUserName).d.d = (Data *)0x0;
    (this->m_lastUserName).d.ptr = (char16_t *)0x0;
    (this->m_lastUserName).d.size = 0;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,8);
      }
    }
  }
  return;
}

Assistant:

void ChatWindow::userLeft(const QString &username)
{
    // store the index of the new row to append to the model containing the messages
    const int newRow = m_chatModel->rowCount();
    // insert a row
    m_chatModel->insertRow(newRow);
    // store in the model the message to comunicate a user left
    m_chatModel->setData(m_chatModel->index(newRow, 0), tr("%1 Left the Chat").arg(username));
    // set the alignment for the text
    m_chatModel->setData(m_chatModel->index(newRow, 0), Qt::AlignCenter, Qt::TextAlignmentRole);
    // set the color for the text
    m_chatModel->setData(m_chatModel->index(newRow, 0), QBrush(Qt::red), Qt::ForegroundRole);
    // scroll the view to display the new message
    ui->chatView->scrollToBottom();
    // reset the last printed username
    m_lastUserName.clear();
}